

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

void __thiscall kj::_::Debug::Context::~Context(Context *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback = (_func_int **)&PTR__Context_002113f0;
  if (((this->value).ptr.isSet == true) &&
     (pcVar1 = (this->value).ptr.field_1.value.description.content.ptr, pcVar1 != (char *)0x0)) {
    sVar2 = (this->value).ptr.field_1.value.description.content.size_;
    (this->value).ptr.field_1.value.description.content.ptr = (char *)0x0;
    (this->value).ptr.field_1.value.description.content.size_ = 0;
    pAVar3 = (this->value).ptr.field_1.value.description.content.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

Debug::Context::~Context() noexcept(false) {}